

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O0

Move<vk::Handle<(vk::HandleType)12>_> *
vkt::api::anon_unknown_1::BufferView::create
          (Move<vk::Handle<(vk::HandleType)12>_> *__return_storage_ptr__,Environment *env,
          Resources *res,Parameters *params)

{
  Handle<(vk::HandleType)8> *pHVar1;
  undefined1 local_60 [8];
  VkBufferViewCreateInfo bufferViewInfo;
  Parameters *params_local;
  Resources *res_local;
  Environment *env_local;
  
  local_60._0_4_ = VK_STRUCTURE_TYPE_BUFFER_VIEW_CREATE_INFO;
  bufferViewInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  bufferViewInfo._4_4_ = 0;
  bufferViewInfo.pNext._0_4_ = 0;
  bufferViewInfo.range = (VkDeviceSize)params;
  pHVar1 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                     (&(res->buffer).object.super_RefBase<vk::Handle<(vk::HandleType)8>_>);
  bufferViewInfo._16_8_ = pHVar1->m_internal;
  bufferViewInfo.buffer.m_internal._0_4_ = *(undefined4 *)(bufferViewInfo.range + 0x10);
  bufferViewInfo._32_8_ = *(undefined8 *)(bufferViewInfo.range + 0x18);
  bufferViewInfo.offset = *(VkDeviceSize *)(bufferViewInfo.range + 0x20);
  ::vk::createBufferView
            (__return_storage_ptr__,env->vkd,env->device,(VkBufferViewCreateInfo *)local_60,
             env->allocationCallbacks);
  return __return_storage_ptr__;
}

Assistant:

static Move<VkBufferView> create (const Environment& env, const Resources& res, const Parameters& params)
	{
		const VkBufferViewCreateInfo	bufferViewInfo	=
		{
			VK_STRUCTURE_TYPE_BUFFER_VIEW_CREATE_INFO,
			DE_NULL,
			(VkBufferViewCreateFlags)0,
			*res.buffer.object,
			params.format,
			params.offset,
			params.range
		};

		return createBufferView(env.vkd, env.device, &bufferViewInfo, env.allocationCallbacks);
	}